

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cc
# Opt level: O2

ObjectArray __thiscall xt::new_object_array(xt *this,uint size)

{
  vector<xt::Object,_std::allocator<xt::Object>_> *__p;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  ObjectArray OVar2;
  
  __p = (vector<xt::Object,_std::allocator<xt::Object>_> *)operator_new(0x18);
  (__p->super__Vector_base<xt::Object,_std::allocator<xt::Object>_>)._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (__p->super__Vector_base<xt::Object,_std::allocator<xt::Object>_>)._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (__p->super__Vector_base<xt::Object,_std::allocator<xt::Object>_>)._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  std::__shared_ptr<std::vector<xt::Object,std::allocator<xt::Object>>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::vector<xt::Object,std::allocator<xt::Object>>,void>
            ((__shared_ptr<std::vector<xt::Object,std::allocator<xt::Object>>,(__gnu_cxx::_Lock_policy)2>
              *)this,__p);
  _Var1._M_pi = extraout_RDX;
  if (size != 0) {
    std::vector<xt::Object,_std::allocator<xt::Object>_>::reserve
              (*(vector<xt::Object,_std::allocator<xt::Object>_> **)this,(ulong)size);
    _Var1._M_pi = extraout_RDX_00;
  }
  OVar2.
  super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  OVar2.
  super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ObjectArray)
         OVar2.
         super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ObjectArray new_object_array(unsigned int size) {
	auto o = ObjectArray(new std::vector<Object>);
	if (size != 0) o->reserve(size);
	return o;
}